

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O2

double mjs::to_number(value *v)

{
  bool bVar1;
  string *s;
  wostream *os;
  double dVar2;
  wstring_view local_198;
  wostringstream _woss;
  
  switch(v->type_) {
  case undefined:
    dVar2 = NAN;
    break;
  case boolean:
    bVar1 = value::boolean_value(v);
    if (bVar1) {
      return 1.0;
    }
  case null:
    dVar2 = 0.0;
    break;
  case number:
    dVar2 = value::number_value(v);
    return dVar2;
  case string:
    s = value::string_value(v);
    dVar2 = to_number(s);
    return dVar2;
  case object:
    to_primitive((value *)&_woss,v,number);
    dVar2 = to_number((value *)&_woss);
    value::~value((value *)&_woss);
    break;
  default:
    std::__cxx11::wostringstream::wostringstream((wostringstream *)&_woss);
    os = std::operator<<((wostream *)&_woss,"Not implemented: ");
    operator<<(os,v->type_);
    std::__cxx11::wstringbuf::str();
    throw_runtime_error(&local_198,
                        "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.cpp"
                        ,0xa4);
  }
  return dVar2;
}

Assistant:

double to_number(const value& v) {
    switch (v.type()) {
    case value_type::undefined: return NAN;
    case value_type::null:      return +0.0;
    case value_type::boolean:   return v.boolean_value() ? 1.0 : +0.0;
    case value_type::number:    return v.number_value();
    case value_type::string:    return to_number(v.string_value());
    case value_type::object:    return to_number(to_primitive(v, value_type::number));
    case value_type::reference: break;
    }
    NOT_IMPLEMENTED(v.type());
}